

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_vcd_trace.cpp
# Opt level: O3

string * __thiscall
sc_core::vcd_trace::compose_line(string *__return_storage_ptr__,vcd_trace *this,string *data)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  undefined1 *local_90;
  long local_88;
  undefined1 local_80 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  undefined1 *local_50;
  long local_48;
  undefined1 local_40 [16];
  
  if (this->bit_width == 1) {
    std::operator+(__return_storage_ptr__,data,&this->vcd_name);
  }
  else if (this->bit_width == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    local_50 = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"b","");
    strip_leading_bits((data->_M_dataplus)._M_p);
    local_90 = local_80;
    std::__cxx11::string::_M_construct<char*>((string *)&local_90,local_50,local_50 + local_48);
    std::__cxx11::string::append((char *)&local_90);
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_90,local_90 + local_88);
    std::__cxx11::string::append((char *)&local_70);
    std::operator+(__return_storage_ptr__,&local_70,&this->vcd_name);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    if (local_90 != local_80) {
      operator_delete(local_90);
    }
    if (local_50 != local_40) {
      operator_delete(local_50);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string
vcd_trace::compose_line(const std::string& data)
{
  if(bit_width == 0)
    return "";
  if(bit_width == 1)
    return data + vcd_name;
  return std::string("b")+strip_leading_bits(data.c_str())+" "+vcd_name;
}